

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sds.cpp
# Opt level: O2

sds duckdb_hll::sdsjoin(char **argv,int argc,char *sep)

{
  sds s;
  ulong uVar1;
  ulong uVar2;
  
  s = sdsempty();
  uVar1 = 0;
  uVar2 = (ulong)(uint)argc;
  if (argc < 1) {
    uVar2 = uVar1;
  }
  for (; uVar2 != uVar1; uVar1 = uVar1 + 1) {
    s = sdscat(s,argv[uVar1]);
    if (argc - 1 != uVar1) {
      s = sdscat(s,sep);
    }
  }
  return s;
}

Assistant:

sds sdsjoin(char **argv, int argc, char *sep) {
    sds join = sdsempty();
    int j;

    for (j = 0; j < argc; j++) {
        join = sdscat(join, argv[j]);
        if (j != argc-1) join = sdscat(join,sep);
    }
    return join;
}